

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_linear.c
# Opt level: O2

int linear_vari_process(SRC_PRIVATE *psrc,SRC_DATA *data)

{
  float fVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  bool bVar12;
  double dVar13;
  double dVar14;
  double local_38;
  
  lVar9 = data->input_frames;
  if (0 < lVar9) {
    pvVar3 = psrc->private_data;
    if (pvVar3 == (void *)0x0) {
      return 5;
    }
    uVar11 = *(uint *)((long)pvVar3 + 4);
    if (*(int *)((long)pvVar3 + 8) != 0) {
      uVar5 = 0;
      uVar7 = 0;
      if (0 < (int)uVar11) {
        uVar7 = (ulong)uVar11;
      }
      for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        *(float *)((long)pvVar3 + uVar5 * 4 + 0x30) = data->data_in[uVar5];
      }
      *(undefined4 *)((long)pvVar3 + 8) = 0;
    }
    lVar9 = lVar9 * (int)uVar11;
    *(long *)((long)pvVar3 + 0x10) = lVar9;
    lVar8 = data->output_frames * (long)(int)uVar11;
    *(long *)((long)pvVar3 + 0x20) = lVar8;
    *(undefined8 *)((long)pvVar3 + 0x28) = 0;
    *(undefined8 *)((long)pvVar3 + 0x18) = 0;
    dVar14 = psrc->last_ratio;
    if (dVar14 < 0.00390625) {
      return 0x16;
    }
    if (256.0 < dVar14) {
      return 0x16;
    }
    dVar13 = psrc->last_position;
    uVar7 = 0;
    local_38 = dVar14;
    uVar5 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar5 = uVar7;
    }
    while (((dVar13 < 1.0 && ((long)uVar7 < lVar8)) &&
           ((dVar13 + 1.0) * (double)(int)uVar11 + 0.0 < (double)lVar9))) {
      if ((0 < lVar8) && (1e-20 < ABS(dVar14 - data->src_ratio))) {
        local_38 = ((data->src_ratio - dVar14) * (double)(long)uVar7) / (double)lVar8 + dVar14;
      }
      for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
        fVar1 = *(float *)((long)pvVar3 + uVar10 * 4 + 0x30);
        data->data_out[uVar7] =
             (float)((double)(data->data_in[uVar10] - fVar1) * dVar13 + (double)fVar1);
        uVar7 = uVar7 + 1;
        *(ulong *)((long)pvVar3 + 0x28) = uVar7;
      }
      dVar13 = dVar13 + 1.0 / local_38;
    }
    while( true ) {
      dVar14 = fmod_one(dVar13);
      iVar2 = *(int *)((long)pvVar3 + 4);
      lVar9 = lrint(dVar13 - dVar14);
      lVar6 = lVar9 * iVar2 + *(long *)((long)pvVar3 + 0x18);
      *(long *)((long)pvVar3 + 0x18) = lVar6;
      lVar9 = *(long *)((long)pvVar3 + 0x28);
      lVar8 = *(long *)((long)pvVar3 + 0x10);
      lVar4 = *(long *)((long)pvVar3 + 0x20);
      if (lVar4 <= lVar9) break;
      uVar11 = *(uint *)((long)pvVar3 + 4);
      if ((double)lVar8 <= (double)(int)uVar11 * dVar14 + (double)lVar6) break;
      if (0 < lVar4) {
        dVar13 = psrc->last_ratio;
        if (1e-20 < ABS(dVar13 - data->src_ratio)) {
          local_38 = ((data->src_ratio - dVar13) * (double)lVar9) / (double)lVar4 + dVar13;
        }
      }
      uVar5 = 0;
      if (0 < (int)uVar11) {
        uVar5 = (ulong)uVar11;
      }
      while( true ) {
        bVar12 = uVar5 == 0;
        uVar5 = uVar5 - 1;
        if (bVar12) break;
        fVar1 = data->data_in[lVar6 - (int)uVar11];
        data->data_out[lVar9] =
             (float)((double)(data->data_in[lVar6] - fVar1) * dVar14 + (double)fVar1);
        *(long *)((long)pvVar3 + 0x28) = lVar9 + 1;
        lVar6 = lVar6 + 1;
        lVar9 = lVar9 + 1;
      }
      dVar13 = dVar14 + 1.0 / local_38;
    }
    if (lVar6 - lVar8 == 0 || lVar6 < lVar8) {
      uVar11 = *(uint *)((long)pvVar3 + 4);
    }
    else {
      uVar11 = *(uint *)((long)pvVar3 + 4);
      dVar14 = dVar14 + (double)((lVar6 - lVar8) / (long)(int)uVar11);
      *(long *)((long)pvVar3 + 0x18) = lVar8;
      lVar6 = lVar8;
    }
    psrc->last_position = dVar14;
    lVar8 = (long)(int)uVar11;
    if (0 < lVar6) {
      uVar5 = 0;
      uVar7 = 0;
      if (0 < (int)uVar11) {
        uVar7 = (ulong)uVar11;
      }
      for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        *(float *)((long)pvVar3 + uVar5 * 4 + 0x30) = data->data_in[(lVar6 + uVar5) - lVar8];
      }
    }
    psrc->last_ratio = local_38;
    data->input_frames_used = lVar6 / lVar8;
    data->output_frames_gen = lVar9 / lVar8;
  }
  return 0;
}

Assistant:

static int
linear_vari_process (SRC_PRIVATE *psrc, SRC_DATA *data)
{	LINEAR_DATA *priv ;
	double		src_ratio, input_index, rem ;
	int			ch ;

	if (data->input_frames <= 0)
		return SRC_ERR_NO_ERROR ;

	if (psrc->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	priv = (LINEAR_DATA*) psrc->private_data ;

	if (priv->reset)
	{	/* If we have just been reset, set the last_value data. */
		for (ch = 0 ; ch < priv->channels ; ch++)
			priv->last_value [ch] = data->data_in [ch] ;
		priv->reset = 0 ;
		} ;

	priv->in_count = data->input_frames * priv->channels ;
	priv->out_count = data->output_frames * priv->channels ;
	priv->in_used = priv->out_gen = 0 ;

	src_ratio = psrc->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	input_index = psrc->last_position ;

	/* Calculate samples before first sample in input array. */
	while (input_index < 1.0 && priv->out_gen < priv->out_count)
	{
		if (priv->in_used + priv->channels * (1.0 + input_index) >= priv->in_count)
			break ;

		if (priv->out_count > 0 && fabs (psrc->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = psrc->last_ratio + priv->out_gen * (data->src_ratio - psrc->last_ratio) / priv->out_count ;

		for (ch = 0 ; ch < priv->channels ; ch++)
		{	data->data_out [priv->out_gen] = (float) (priv->last_value [ch] + input_index *
										(data->data_in [ch] - priv->last_value [ch])) ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		} ;

	rem = fmod_one (input_index) ;
	priv->in_used += priv->channels * lrint (input_index - rem) ;
	input_index = rem ;

	/* Main processing loop. */
	while (priv->out_gen < priv->out_count && priv->in_used + priv->channels * input_index < priv->in_count)
	{
		if (priv->out_count > 0 && fabs (psrc->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = psrc->last_ratio + priv->out_gen * (data->src_ratio - psrc->last_ratio) / priv->out_count ;

		if (SRC_DEBUG && priv->in_used < priv->channels && input_index < 1.0)
		{	printf ("Whoops!!!!   in_used : %ld     channels : %d     input_index : %f\n", priv->in_used, priv->channels, input_index) ;
			exit (1) ;
			} ;

		for (ch = 0 ; ch < priv->channels ; ch++)
		{	data->data_out [priv->out_gen] = (float) (data->data_in [priv->in_used - priv->channels + ch] + input_index *
						(data->data_in [priv->in_used + ch] - data->data_in [priv->in_used - priv->channels + ch])) ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		priv->in_used += priv->channels * lrint (input_index - rem) ;
		input_index = rem ;
		} ;

	if (priv->in_used > priv->in_count)
	{	input_index += (priv->in_used - priv->in_count) / priv->channels ;
		priv->in_used = priv->in_count ;
		} ;

	psrc->last_position = input_index ;

	if (priv->in_used > 0)
		for (ch = 0 ; ch < priv->channels ; ch++)
			priv->last_value [ch] = data->data_in [priv->in_used - priv->channels + ch] ;

	/* Save current ratio rather then target ratio. */
	psrc->last_ratio = src_ratio ;

	data->input_frames_used = priv->in_used / priv->channels ;
	data->output_frames_gen = priv->out_gen / priv->channels ;

	return SRC_ERR_NO_ERROR ;
}